

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::DepthStencilCase::DepthStencilCase
          (DepthStencilCase *this,Context *context,char *name,char *desc,
          vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
          *cases)

{
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  *cases_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  DepthStencilCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DepthStencilCase_00cb4440;
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::vector(&this->m_cases,cases);
  DepthStencilCaseUtil::TestRenderTarget::TestRenderTarget(&this->m_renderTarget);
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::ClearCommand>_>
  ::vector(&this->m_baseClears);
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
  ::vector(&this->m_baseDepthRenders);
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
  ::vector(&this->m_visualizeCommands);
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
  ::vector(&this->m_refBaseDepthRenders);
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
  ::vector(&this->m_refVisualizeCommands);
  this->m_renderer = (QuadRenderer *)0x0;
  this->m_refColorBuffer = (Surface *)0x0;
  this->m_refDepthBuffer = (TextureLevel *)0x0;
  this->m_refStencilBuffer = (TextureLevel *)0x0;
  this->m_refRenderer = (ReferenceQuadRenderer *)0x0;
  this->m_iterNdx = 0;
  return;
}

Assistant:

DepthStencilCase::DepthStencilCase (Context& context, const char* name, const char* desc, const std::vector<DepthStencilParams>& cases)
	: TestCase				(context, name, desc)
	, m_cases				(cases)
	, m_renderer			(DE_NULL)
	, m_refColorBuffer		(DE_NULL)
	, m_refDepthBuffer		(DE_NULL)
	, m_refStencilBuffer	(DE_NULL)
	, m_refRenderer			(DE_NULL)
	, m_iterNdx				(0)
{
}